

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrImage.c
# Opt level: O0

Bbr_ImagePart_t ** Bbr_CreateParts(DdManager *dd,int nParts,DdNode **pbParts,DdNode *bCare)

{
  int iVar1;
  Bbr_ImagePart_t **ppBVar2;
  Bbr_ImagePart_t *pBVar3;
  DdNode *pDVar4;
  int local_34;
  int i;
  Bbr_ImagePart_t **pParts;
  DdNode *bCare_local;
  DdNode **pbParts_local;
  int nParts_local;
  DdManager *dd_local;
  
  ppBVar2 = (Bbr_ImagePart_t **)malloc((long)(nParts + 1) << 3);
  for (local_34 = 0; local_34 < nParts; local_34 = local_34 + 1) {
    pBVar3 = (Bbr_ImagePart_t *)malloc(0x18);
    ppBVar2[local_34] = pBVar3;
    ppBVar2[local_34]->bFunc = pbParts[local_34];
    Cudd_Ref(ppBVar2[local_34]->bFunc);
    pDVar4 = Cudd_Support(dd,ppBVar2[local_34]->bFunc);
    ppBVar2[local_34]->bSupp = pDVar4;
    Cudd_Ref(ppBVar2[local_34]->bSupp);
    iVar1 = Cudd_SupportSize(dd,ppBVar2[local_34]->bSupp);
    ppBVar2[local_34]->nSupp = (short)iVar1;
    iVar1 = Cudd_DagSize(ppBVar2[local_34]->bFunc);
    ppBVar2[local_34]->nNodes = iVar1;
    ppBVar2[local_34]->iPart = (short)local_34;
  }
  pBVar3 = (Bbr_ImagePart_t *)malloc(0x18);
  ppBVar2[nParts] = pBVar3;
  ppBVar2[nParts]->bFunc = bCare;
  Cudd_Ref(ppBVar2[nParts]->bFunc);
  pDVar4 = Cudd_Support(dd,ppBVar2[nParts]->bFunc);
  ppBVar2[nParts]->bSupp = pDVar4;
  Cudd_Ref(ppBVar2[nParts]->bSupp);
  iVar1 = Cudd_SupportSize(dd,ppBVar2[nParts]->bSupp);
  ppBVar2[nParts]->nSupp = (short)iVar1;
  iVar1 = Cudd_DagSize(ppBVar2[nParts]->bFunc);
  ppBVar2[nParts]->nNodes = iVar1;
  ppBVar2[nParts]->iPart = (short)nParts;
  return ppBVar2;
}

Assistant:

Bbr_ImagePart_t ** Bbr_CreateParts( DdManager * dd,
    int nParts, DdNode ** pbParts, DdNode * bCare )
{
    Bbr_ImagePart_t ** pParts;
    int i;

    // start the partitions
    pParts = ABC_ALLOC( Bbr_ImagePart_t *, nParts + 1 );
    // create structures for each variable
    for ( i = 0; i < nParts; i++ )
    {
        pParts[i] = ABC_ALLOC( Bbr_ImagePart_t, 1 );
        pParts[i]->bFunc  = pbParts[i];                           Cudd_Ref( pParts[i]->bFunc );
        pParts[i]->bSupp  = Cudd_Support( dd, pParts[i]->bFunc ); Cudd_Ref( pParts[i]->bSupp );
        pParts[i]->nSupp  = Cudd_SupportSize( dd, pParts[i]->bSupp );
        pParts[i]->nNodes = Cudd_DagSize( pParts[i]->bFunc );
        pParts[i]->iPart  = i;
    }
    // add the care set as the last partition
    pParts[nParts] = ABC_ALLOC( Bbr_ImagePart_t, 1 );
    pParts[nParts]->bFunc = bCare;                                     Cudd_Ref( pParts[nParts]->bFunc );
    pParts[nParts]->bSupp = Cudd_Support( dd, pParts[nParts]->bFunc ); Cudd_Ref( pParts[nParts]->bSupp );
    pParts[nParts]->nSupp = Cudd_SupportSize( dd, pParts[nParts]->bSupp );
    pParts[nParts]->nNodes = Cudd_DagSize( pParts[nParts]->bFunc );
    pParts[nParts]->iPart  = nParts;
    return pParts;
}